

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O0

void do_aedit(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  AREA_DATA_conflict *pAVar3;
  char *pcVar4;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var5;
  char arg [4608];
  char value2 [4608];
  int value;
  AREA_DATA_conflict *pArea;
  CHAR_DATA *in_stack_ffffffffffffdbd8;
  char *in_stack_ffffffffffffdbe0;
  CHAR_DATA *in_stack_ffffffffffffdbe8;
  char *in_stack_ffffffffffffdbf0;
  char local_1228 [64];
  char *in_stack_ffffffffffffee18;
  CHAR_DATA *in_stack_ffffffffffffee20;
  AREA_DATA_conflict *local_18;
  
  bVar1 = check_security(in_stack_ffffffffffffdbd8);
  if (!bVar1) {
    return;
  }
  local_18 = in_RDI->in_room->area;
  one_argument(in_stack_ffffffffffffdbe0,(char *)in_stack_ffffffffffffdbd8);
  bVar1 = is_number((char *)in_stack_ffffffffffffdbd8);
  if (bVar1) {
    iVar2 = atoi(&stack0xffffffffffffdbd8);
    local_18 = get_area_data(iVar2);
    if (local_18 == (AREA_DATA_conflict *)0x0) {
      send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
      return;
    }
  }
  else {
    bVar1 = str_cmp(&stack0xffffffffffffdbd8,"create");
    if (!bVar1) {
      bVar1 = is_npc(in_stack_ffffffffffffdbd8);
      if ((!bVar1) && (in_RDI->pcdata->security < 9)) {
        send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
        return;
      }
      one_argument(in_stack_ffffffffffffdbe0,(char *)in_stack_ffffffffffffdbd8);
      iVar2 = atoi(local_1228);
      pAVar3 = get_area_data(iVar2);
      if (pAVar3 != (AREA_DATA_conflict *)0x0) {
        send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
        return;
      }
      local_18 = new_area();
      area_last->next = local_18;
      area_last = local_18;
      _Var5 = std::pow<int,int>(0,0x76ec5d);
      local_18->area_flags[0] = (long)_Var5 | local_18->area_flags[0];
      send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
    }
  }
  bVar1 = is_switched(in_RDI);
  if ((bVar1) ||
     ((((local_18->security < in_RDI->pcdata->security ||
        (pcVar4 = strstr(local_18->builders,in_RDI->name), pcVar4 == (char *)0x0)) &&
       (in_RDI->pcdata->security <= local_18->security)) &&
      (pcVar4 = strstr(local_18->builders,"All"), pcVar4 == (char *)0x0)))) {
    send_to_char(in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
  }
  else {
    in_RDI->desc->pEdit = local_18;
    in_RDI->desc->editor = 1;
    aedit_show(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  }
  return;
}

Assistant:

void do_aedit(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	int value;
	char value2[MAX_STRING_LENGTH];
	char arg[MAX_STRING_LENGTH];

	if (!check_security(ch))
		return;

	pArea = ch->in_room->area;

	argument = one_argument(argument, arg);

	if (is_number(arg))
	{
		value = atoi(arg);
		if (!(pArea = get_area_data(value)))
		{
			send_to_char("That area vnum does not exist.\n\r", ch);
			return;
		}
	}
	else
	{
		if (!str_cmp(arg, "create"))
		{
			if (!is_npc(ch) && (ch->pcdata->security < 9))
			{
				send_to_char("You do not have the access to create areas.\n\r", ch);
				return;
			}

			argument = one_argument(argument, value2);
			value = atoi(value2);

			if (get_area_data(value) != nullptr)
			{
				send_to_char("That area already exists!", ch);
				return;
			}

			pArea = new_area();
			area_last->next = pArea;
			area_last = pArea; /* Thanks, Walker. */

			SET_BIT(pArea->area_flags, AREA_ADDED);

			send_to_char("Area created.\n\r", ch);
		}
	}

	if (!IS_BUILDER(ch, pArea))
	{
		send_to_char("You have insufficent security to edit that area.\n\r", ch);
		return;
	}

	ch->desc->pEdit = (void *)pArea;
	ch->desc->editor = ED_AREA;

	aedit_show(ch, "");
}